

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O2

undefined1 * plt_get_real_fn(plt_ctx ctx,char *name)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  plt_lib lib;
  int iVar5;
  uint8_t *name_1;
  void *pvVar6;
  void *pvVar7;
  uint *puVar8;
  byte *pbVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  link_map **pplVar14;
  uint uVar15;
  
  pplVar14 = &ctx->r_map;
LAB_00107a73:
  lib = *pplVar14;
  if (lib == (plt_lib)0x0) {
    return (undefined1 *)0x0;
  }
  pvVar6 = lib_dt_lookup(lib,6);
  pvVar7 = lib_dt_lookup(lib,5);
  if (pvVar7 != (void *)0x0 && pvVar6 != (void *)0x0) {
    puVar8 = (uint *)lib_dt_lookup(lib,0x6ffffef5);
    if (puVar8 == (uint *)0x0) {
      puVar8 = (uint *)lib_dt_lookup(lib,4);
      if (puVar8 != (uint *)0x0) {
        uVar2 = *puVar8;
        uVar10 = 0;
        for (pbVar9 = (byte *)name; (ulong)*pbVar9 != 0; pbVar9 = pbVar9 + 1) {
          uVar10 = uVar10 * 0x10 + (ulong)*pbVar9;
          uVar11 = (uint)uVar10 & 0xf0000000;
          uVar10 = ~(ulong)uVar11 & (uVar11 >> 0x18 ^ uVar10);
        }
        lVar13 = uVar10 % (ulong)uVar2 + 2;
        while (uVar10 = (ulong)puVar8[lVar13], uVar10 != 0) {
          lVar13 = uVar10 * 0x18;
          iVar5 = mmk_streq((char *)((ulong)*(uint *)((long)pvVar6 + lVar13) + (long)pvVar7),name);
          if (iVar5 != 0) goto LAB_00107c39;
          lVar13 = (ulong)uVar2 + uVar10 + 2;
        }
      }
    }
    else {
      uVar2 = *puVar8;
      uVar10 = (ulong)puVar8[2];
      uVar12 = 0x1505;
      pbVar9 = (byte *)name;
      while( true ) {
        bVar1 = *pbVar9;
        uVar11 = (uint)uVar12;
        if (bVar1 == 0) break;
        pbVar9 = pbVar9 + 1;
        uVar12 = (ulong)(uVar11 * 0x21 + (uint)bVar1);
      }
      if (((*(ulong *)(puVar8 + ((uVar12 >> 6) % uVar10) * 2 + 4) >> (uVar12 & 0x3f) & 1) != 0) &&
         ((*(ulong *)(puVar8 + ((uVar12 >> 6) % uVar10) * 2 + 4) >>
           ((ulong)(uVar11 >> ((byte)puVar8[3] & 0x1f)) & 0x3f) & 1) != 0)) {
        uVar15 = puVar8[uVar10 * 2 + uVar12 % (ulong)uVar2 + 4];
        uVar3 = puVar8[1];
        do {
          uVar4 = puVar8[uVar10 * 2 + (ulong)uVar2 + (ulong)(uVar15 - uVar3) + 4];
          if ((uVar4 ^ uVar11) < 2) {
            lVar13 = (ulong)uVar15 * 0x18;
            iVar5 = strcmp((char *)((ulong)*(uint *)((long)pvVar6 + lVar13) + (long)pvVar7),name);
            if (iVar5 == 0) goto LAB_00107c39;
          }
          uVar15 = uVar15 + 1;
        } while ((uVar4 & 1) == 0);
      }
    }
  }
  goto LAB_00107c40;
LAB_00107c39:
  if (*(long *)((long)pvVar6 + lVar13 + 0x10) != 0) {
    return (undefined1 *)(lib->l_addr + *(long *)((long)pvVar6 + lVar13 + 8));
  }
LAB_00107c40:
  pplVar14 = &lib->l_next;
  goto LAB_00107a73;
}

Assistant:

plt_fn *plt_get_real_fn(plt_ctx ctx, const char *name)
{
    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        ElfW(Sym) *sym = sym_lookup_dyn(lm, name);
        if (sym) {
            /* Some compilers (e.g. ICC) put unresolved symbols into the
               symbol table with a size of 0. We ignore them to avoid
               getting the address of the PLT stub. */
            if (sym->st_size == 0)
                continue;

            return (void *) (sym->st_value + lm->l_addr);
        }
    }
    return NULL;
}